

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

void __thiscall
cmELFInternalImpl<cmELFTypes64>::ByteSwap(cmELFInternalImpl<cmELFTypes64> *this,ELF_Dyn *dyn)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  ushort uVar4;
  Elf64_Sxword EVar5;
  
  EVar5 = dyn->d_tag;
  *(undefined1 *)&dyn->d_tag = *(undefined1 *)((long)&dyn->d_tag + 7);
  *(char *)((long)&dyn->d_tag + 7) = (char)EVar5;
  uVar3 = *(ushort *)((long)&dyn->d_tag + 1);
  uVar4 = *(ushort *)((long)&dyn->d_tag + 5);
  *(ushort *)((long)&dyn->d_tag + 1) = uVar4 << 8 | uVar4 >> 8;
  *(ushort *)((long)&dyn->d_tag + 5) = uVar3 << 8 | uVar3 >> 8;
  puVar1 = (ushort *)((long)&dyn->d_tag + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  uVar3 = *(ushort *)&dyn->d_un;
  uVar4 = *(ushort *)((long)&dyn->d_un + 6);
  *(ushort *)&dyn->d_un = uVar4 << 8 | uVar4 >> 8;
  *(ushort *)((long)&dyn->d_un + 6) = uVar3 << 8 | uVar3 >> 8;
  uVar2 = *(undefined1 *)((long)&dyn->d_un + 2);
  *(undefined1 *)((long)&dyn->d_un + 2) = *(undefined1 *)((long)&dyn->d_un + 5);
  *(undefined1 *)((long)&dyn->d_un + 5) = uVar2;
  puVar1 = (ushort *)((long)&dyn->d_un + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

static void cmELFByteSwap(char* data, cmELFByteSwapSize<8> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[7];
  data[7] = one_byte;
  one_byte = data[1];
  data[1] = data[6];
  data[6] = one_byte;
  one_byte = data[2];
  data[2] = data[5];
  data[5] = one_byte;
  one_byte = data[3];
  data[3] = data[4];
  data[4] = one_byte;
}